

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipgraph.h
# Opt level: O2

void __thiscall
libDAI::BipartiteGraph<libDAI::FRegion,_libDAI::Region>::Regenerate
          (BipartiteGraph<libDAI::FRegion,_libDAI::Region> *this)

{
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_01;
  pair<unsigned_long,_unsigned_long> *ppVar1;
  pointer pvVar2;
  pointer ppVar3;
  unsigned_long uVar4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var5;
  long lVar6;
  unsigned_long *puVar7;
  size_t i1;
  ulong uVar8;
  size_t i2;
  pointer ppVar9;
  long lVar10;
  allocator_type local_51;
  value_type_conflict2 local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> col;
  
  this_00 = &this->_nb1;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(this_00);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(this_00,(long)(this->_V1).
                         super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_V1).
                         super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 6);
  this_01 = &this->_nb2;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(this_01,((long)(this->_V2).
                          super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_V2).
                         super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>._M_impl
                         .super__Vector_impl_data._M_start) / 0x28);
  for (ppVar9 = (this->_E12).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar9 != (this->_E12).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar9 = ppVar9 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((this_00->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + ppVar9->first,&ppVar9->second);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((this_01->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + ppVar9->second,&ppVar9->first);
  }
  lVar10 = 0;
  for (uVar8 = 0;
      uVar8 < (ulong)((long)(this->_V1).
                            super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_V1).
                            super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 6); uVar8 = uVar8 + 1) {
    pvVar2 = (this_00->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    _Var5 = std::
            __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (*(undefined8 *)
                        ((long)&(pvVar2->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data + lVar10),
                       *(undefined8 *)
                        ((long)&(pvVar2->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data + lVar10 + 8));
    pvVar2 = (this_00->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data + lVar10),(const_iterator)_Var5._M_current,
               (const_iterator)
               *(unsigned_long **)
                ((long)&(pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data + lVar10 + 8));
    lVar10 = lVar10 + 0x18;
  }
  lVar10 = 0;
  for (uVar8 = 0;
      lVar6 = (long)(this->_V2).super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_V2).super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>.
                    _M_impl.super__Vector_impl_data._M_start, uVar8 < (ulong)(lVar6 / 0x28);
      uVar8 = uVar8 + 1) {
    pvVar2 = (this_01->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    _Var5 = std::
            __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (*(undefined8 *)
                        ((long)&(pvVar2->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data + lVar10),
                       *(undefined8 *)
                        ((long)&(pvVar2->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data + lVar10 + 8),lVar6 % 0x28);
    pvVar2 = (this_01->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data + lVar10),(const_iterator)_Var5._M_current,
               (const_iterator)
               *(unsigned_long **)
                ((long)&(pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data + lVar10 + 8));
    lVar10 = lVar10 + 0x18;
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(&this->_E12ind);
  local_50 = 0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&col,((long)(this->_V2).
                         super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)(this->_V2).
                        super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x28,&local_50,&local_51);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_fill_assign(&this->_E12ind,
                   (long)(this->_V1).
                         super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_V1).
                         super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 6,&col);
  ppVar9 = (this->_E12).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->_E12).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (this->_E12ind).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar7 = &ppVar9->second;
  for (lVar10 = 0; (long)ppVar3 - (long)ppVar9 >> 4 != lVar10; lVar10 = lVar10 + 1) {
    ppVar1 = (pair<unsigned_long,_unsigned_long> *)(puVar7 + -1);
    uVar4 = *puVar7;
    puVar7 = puVar7 + 2;
    *(long *)(*(long *)&pvVar2[ppVar1->first].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data + uVar4 * 8) = lVar10;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&col.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void Regenerate() {
                // Calculate _nb1 and _nb2

                // Start with empty vectors
                _nb1.clear();
                _nb1.resize(_V1.size());
                // Start with empty vectors
                _nb2.clear();
                _nb2.resize(_V2.size());
                // Each edge yields a neighbour pair
                for( std::vector<edge_type>::const_iterator e = _E12.begin(); e != _E12.end(); e++ ) {
                    _nb1[e->first].push_back(e->second);
                    _nb2[e->second].push_back(e->first);
                }
                // Remove duplicates from _nb1
                for( size_t i1 = 0; i1 < _V1.size(); i1++ ) {
                    nb_type::iterator new_end = unique(_nb1[i1].begin(), _nb1[i1].end());
                    _nb1[i1].erase( new_end, _nb1[i1].end() );
                }
                // Remove duplicates from _nb2
                for( size_t i2 = 0; i2 < _V2.size(); i2++ ) {
                    nb_type::iterator new_end = unique(_nb2[i2].begin(), _nb2[i2].end());
                    _nb2[i2].erase( new_end, _nb2[i2].end() );
                }

                // Calculate _E12ind
                
                // Allocate data structures
                _E12ind.clear();
                std::vector<size_t> col(_V2.size(),-1);
                _E12ind.assign(_V1.size(), col);
                // Assign elements
                for( size_t k = 0; k < _E12.size(); k++ )
                    _E12ind[_E12[k].first][_E12[k].second] = k;
            }